

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right,Option *opt)

{
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined8 in_stack_00000008;
  ParamDict pd;
  Layer *crop;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  ParamDict *in_stack_ffffffffffffffc0;
  ParamDict local_38;
  Layer *local_28;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  undefined8 local_10;
  long local_8;
  
  if ((*(int *)(in_RDI + 0x2c) < (int)(in_R8D + in_R9D)) ||
     (*(int *)(in_RDI + 0x30) < (int)(in_EDX + in_ECX))) {
    fprintf(_stderr,
            "copy_cut_border parameter error, top: %d, bottom: %d, left: %d, right: %d, src.w: %d, src.h: %d"
            ,(ulong)in_EDX,(ulong)in_ECX,(ulong)in_R8D,(ulong)in_R9D,*(undefined4 *)(in_RDI + 0x2c),
            *(undefined4 *)(in_RDI + 0x30));
    fprintf(_stderr,"\n");
  }
  else {
    local_20 = in_R9D;
    local_1c = in_R8D;
    local_18 = in_ECX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    local_28 = create_layer((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    ParamDict::ParamDict(in_stack_ffffffffffffffc0);
    ParamDict::set(&local_38,0,local_1c);
    ParamDict::set(&local_38,1,local_14);
    ParamDict::set(&local_38,2,0);
    ParamDict::set(&local_38,3,(*(int *)(local_8 + 0x2c) - local_1c) - local_20);
    ParamDict::set(&local_38,4,(*(int *)(local_8 + 0x30) - local_14) - local_18);
    ParamDict::set(&local_38,5,-0xe9);
    (*local_28->_vptr_Layer[2])(local_28,&local_38);
    (*local_28->_vptr_Layer[4])(local_28,in_stack_00000008);
    (*local_28->_vptr_Layer[7])(local_28,local_8,local_10,in_stack_00000008);
    (*local_28->_vptr_Layer[5])(local_28,in_stack_00000008);
    if (local_28 != (Layer *)0x0) {
      (*local_28->_vptr_Layer[1])();
    }
    ParamDict::~ParamDict
              ((ParamDict *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, const Option& opt)
{
    if (left + right > src.w || top + bottom > src.h)
    {
        NCNN_LOGE("copy_cut_border parameter error, top: %d, bottom: %d, left: %d, right: %d, src.w: %d, src.h: %d", top, bottom, left, right, src.w, src.h);
        return;
    }
    Layer* crop = create_layer(LayerType::Crop);

    ParamDict pd;
    pd.set(0, left);
    pd.set(1, top);
    pd.set(2, 0);
    pd.set(3, src.w - left - right);
    pd.set(4, src.h - top - bottom);
    pd.set(5, -233);

    crop->load_param(pd);

    crop->create_pipeline(opt);

    crop->forward(src, dst, opt);

    crop->destroy_pipeline(opt);

    delete crop;
}